

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitRefI31(PrintExpressionContents *this,RefI31 *curr)

{
  ostream *o;
  char *pcVar1;
  bool bVar2;
  bool local_39;
  string_view local_38;
  HeapType local_28;
  BasicType local_20;
  bool local_19;
  RefI31 *pRStack_18;
  bool shared;
  RefI31 *curr_local;
  PrintExpressionContents *this_local;
  
  local_20 = unreachable;
  pRStack_18 = curr;
  curr_local = (RefI31 *)this;
  bVar2 = wasm::Type::operator!=
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)59>).super_Expression.
                      type,&local_20);
  local_39 = false;
  if (bVar2) {
    local_28 = wasm::Type::getHeapType
                         (&(pRStack_18->super_SpecificExpression<(wasm::Expression::Id)59>).
                           super_Expression.type);
    local_39 = HeapType::isShared(&local_28);
  }
  local_19 = local_39;
  o = this->o;
  pcVar1 = "expected end of ref.i31";
  if (local_39 != false) {
    pcVar1 = "expected end of ref.i31_shared";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,pcVar1 + 0x10);
  printMedium(o,local_38);
  return;
}

Assistant:

void visitRefI31(RefI31* curr) {
    bool shared =
      curr->type != Type::unreachable && curr->type.getHeapType().isShared();
    printMedium(o, shared ? "ref.i31_shared" : "ref.i31");
  }